

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void FASTCOVER_tryParameters(void *opaque)

{
  long lVar1;
  undefined1 auVar2 [16];
  COVER_dictSelection_t selection_00;
  COVER_dictSelection_t selection_01;
  ZDICT_cover_params_t parameters_00;
  COVER_dictSelection_t selection_02;
  ZDICT_cover_params_t params;
  ZDICT_cover_params_t parameters_01;
  undefined4 uVar3;
  uint uVar4;
  FASTCOVER_ctx_t *ctx_00;
  U32 *freqs_00;
  void *__dest;
  size_t dictContentSize;
  long *in_RDI;
  uint nbFinalizeSamples;
  size_t tail;
  U32 *freqs;
  COVER_dictSelection_t selection;
  BYTE *dict;
  U16 *segmentFreqs;
  size_t totalCompressedSize;
  size_t dictBufferCapacity;
  ZDICT_cover_params_t parameters;
  FASTCOVER_ctx_t *ctx;
  FASTCOVER_tryParameters_data_t *data;
  undefined8 local_128;
  size_t in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 *in_stack_ffffffffffffff38;
  undefined8 *puVar5;
  undefined8 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  U16 *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  undefined8 uVar6;
  size_t __size;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t *in_stack_ffffffffffffffc8;
  COVER_best_t *in_stack_ffffffffffffffd0;
  
  puVar5 = &local_128;
  lVar1 = *in_RDI;
  memcpy(&stack0xffffffffffffffa8,in_RDI + 3,0x30);
  __size = in_RDI[2];
  uVar6 = 0xffffffffffffffff;
  ctx_00 = (FASTCOVER_ctx_t *)calloc(1L << ((byte)*(undefined4 *)(lVar1 + 0x44) & 0x3f),2);
  freqs_00 = (U32 *)malloc(__size);
  COVER_dictSelectionError(in_stack_fffffffffffffee0);
  __dest = malloc((1L << ((byte)*(undefined4 *)(lVar1 + 0x44) & 0x3f)) << 2);
  if (((ctx_00 == (FASTCOVER_ctx_t *)0x0) || (freqs_00 == (U32 *)0x0)) || (__dest == (void *)0x0)) {
    puVar5 = (undefined8 *)in_stack_ffffffffffffff38;
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Failed to allocate buffers: out of memory\n");
      fflush(_stderr);
      puVar5 = (undefined8 *)in_stack_ffffffffffffff38;
    }
  }
  else {
    local_128 = in_stack_ffffffffffffffa8;
    memcpy(__dest,*(void **)(lVar1 + 0x38),(1L << ((byte)*(undefined4 *)(lVar1 + 0x44) & 0x3f)) << 2
          );
    parameters_01.steps = (int)local_128;
    parameters_01.nbThreads = (int)((ulong)local_128 >> 0x20);
    parameters_01.k = (int)__size;
    parameters_01.d = (int)(__size >> 0x20);
    parameters_01.splitPoint = (double)in_stack_ffffffffffffffb0;
    parameters_01.shrinkDict = (int)in_stack_ffffffffffffffb8;
    parameters_01.shrinkDictMaxRegression = (int)(in_stack_ffffffffffffffb8 >> 0x20);
    parameters_01.zParams.compressionLevel = (int)in_stack_ffffffffffffffc0;
    parameters_01.zParams.notificationLevel = (int)(in_stack_ffffffffffffffc0 >> 0x20);
    parameters_01._40_8_ = in_stack_ffffffffffffffc8;
    in_stack_ffffffffffffff28 = uVar6;
    uVar6 = local_128;
    dictContentSize =
         FASTCOVER_buildDictionary
                   (ctx_00,freqs_00,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                    parameters_01,in_stack_ffffffffffffff70);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(long *)(lVar1 + 0x20) * (ulong)*(uint *)(lVar1 + 0x48);
    uVar3 = SUB164(auVar2 / ZEXT816(100),0);
    in_stack_ffffffffffffff20 = *(undefined8 *)(lVar1 + 8);
    local_128 = CONCAT44(local_128._4_4_,uVar3);
    params.steps = (int)__size;
    params.nbThreads = (int)(__size >> 0x20);
    params.k = (int)in_stack_ffffffffffffff28;
    params.d = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    params.splitPoint = (double)uVar6;
    params.shrinkDict = (int)in_stack_ffffffffffffffb0;
    params.shrinkDictMaxRegression = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    params.zParams.compressionLevel = (int)in_stack_ffffffffffffffb8;
    params.zParams.notificationLevel = (int)(in_stack_ffffffffffffffb8 >> 0x20);
    params._40_8_ = in_stack_ffffffffffffffc0;
    COVER_selectDict((BYTE *)in_stack_ffffffffffffff70,(size_t)__dest,dictContentSize,
                     (BYTE *)CONCAT44(uVar3,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50,
                     (uint)in_stack_ffffffffffffff80,(size_t)freqs_00,(size_t)ctx_00,params,
                     in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffd0);
    selection_01.dictSize = in_stack_ffffffffffffffb0;
    selection_01.dictContent = (BYTE *)uVar6;
    selection_01.totalCompressedSize = in_stack_ffffffffffffffb8;
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff48;
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff50;
    uVar4 = COVER_dictSelectionIsError(selection_01);
    if ((uVar4 != 0) && (0 < g_displayLevel)) {
      fprintf(_stderr,"Failed to select dictionary\n");
      fflush(_stderr);
    }
  }
  free(freqs_00);
  parameters_00._8_8_ = in_stack_ffffffffffffff80;
  parameters_00.k = (int)in_stack_ffffffffffffff78;
  parameters_00.d = (int)(in_stack_ffffffffffffff78 >> 0x20);
  parameters_00.splitPoint = (double)in_stack_ffffffffffffff20;
  parameters_00.shrinkDict = (int)in_stack_ffffffffffffff28;
  parameters_00.shrinkDictMaxRegression = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  parameters_00.zParams.compressionLevel = (int)in_stack_ffffffffffffff30;
  parameters_00.zParams.notificationLevel = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  parameters_00._40_8_ = puVar5;
  selection_02.dictSize = in_stack_ffffffffffffff48;
  selection_02.dictContent = (BYTE *)in_stack_ffffffffffffff40;
  selection_02.totalCompressedSize = (size_t)in_stack_ffffffffffffff50;
  COVER_best_finish(in_stack_ffffffffffffffd0,parameters_00,selection_02);
  free(in_RDI);
  free(ctx_00);
  selection_00.dictSize = (size_t)in_stack_ffffffffffffff80;
  selection_00.dictContent = (BYTE *)in_stack_ffffffffffffff78;
  selection_00.totalCompressedSize = in_stack_ffffffffffffffc0;
  COVER_dictSelectionFree(selection_00);
  free(__dest);
  return;
}

Assistant:

static void FASTCOVER_tryParameters(void* opaque)
{
  /* Save parameters as local variables */
  FASTCOVER_tryParameters_data_t *const data = (FASTCOVER_tryParameters_data_t*)opaque;
  const FASTCOVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Initialize array to keep track of frequency of dmer within activeSegment */
  U16* segmentFreqs = (U16*)calloc(((U64)1 << ctx->f), sizeof(U16));
  /* Allocate space for hash table, dict, and freqs */
  BYTE *const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* freqs = (U32*) malloc(((U64)1 << ctx->f) * sizeof(U32));
  if (!segmentFreqs || !dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ((U64)1 << ctx->f) * sizeof(U32));
  /* Build the dictionary */
  { const size_t tail = FASTCOVER_buildDictionary(ctx, freqs, dict, dictBufferCapacity,
                                                    parameters, segmentFreqs);

    const unsigned nbFinalizeSamples = (unsigned)(ctx->nbTrainSamples * ctx->accelParams.finalize / 100);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
         ctx->samples, ctx->samplesSizes, nbFinalizeSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
         totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  free(segmentFreqs);
  COVER_dictSelectionFree(selection);
  free(freqs);
}